

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:578:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:578:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  value *pvVar1;
  value *pvVar2;
  object_ptr *o;
  wstring_view local_70;
  gc_heap_ptr_untyped local_60;
  gc_heap_ptr_untyped local_50;
  
  pvVar2 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  o = value::object_value(this_);
  pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pvVar2 == pvVar1) {
    local_70._M_str = L",";
    local_70._M_len = 1;
  }
  else {
    to_string((mjs *)&local_50,h,pvVar2);
    local_70 = string::view((string *)&local_50);
  }
  anon_unknown_110::array_join((anon_unknown_110 *)&local_60,o,&local_70);
  value::value(__return_storage_ptr__,(string *)&local_60);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
  if (pvVar2 != pvVar1) {
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }